

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O0

int i2r_crldp(X509V3_EXT_METHOD *method,void *pcrldp,BIO *out,int indent)

{
  size_t sVar1;
  DIST_POINT *pDVar2;
  ulong local_40;
  size_t i;
  DIST_POINT *point;
  stack_st_DIST_POINT *crld;
  int indent_local;
  BIO *out_local;
  void *pcrldp_local;
  X509V3_EXT_METHOD *method_local;
  
  local_40 = 0;
  while( true ) {
    sVar1 = sk_DIST_POINT_num((stack_st_DIST_POINT *)pcrldp);
    if (sVar1 <= local_40) break;
    BIO_puts((BIO *)out,"\n");
    pDVar2 = sk_DIST_POINT_value((stack_st_DIST_POINT *)pcrldp,local_40);
    if (pDVar2->distpoint != (DIST_POINT_NAME *)0x0) {
      print_distpoint(out,pDVar2->distpoint,indent);
    }
    if (pDVar2->reasons != (ASN1_BIT_STRING *)0x0) {
      print_reasons(out,"Reasons",pDVar2->reasons,indent);
    }
    if (pDVar2->CRLissuer != (GENERAL_NAMES *)0x0) {
      BIO_printf((BIO *)out,"%*sCRL Issuer:\n",(ulong)(uint)indent,"");
      print_gens(out,pDVar2->CRLissuer,indent);
    }
    local_40 = local_40 + 1;
  }
  return 1;
}

Assistant:

static int i2r_crldp(const X509V3_EXT_METHOD *method, void *pcrldp, BIO *out,
                     int indent) {
  STACK_OF(DIST_POINT) *crld = reinterpret_cast<STACK_OF(DIST_POINT) *>(pcrldp);
  DIST_POINT *point;
  size_t i;
  for (i = 0; i < sk_DIST_POINT_num(crld); i++) {
    BIO_puts(out, "\n");
    point = sk_DIST_POINT_value(crld, i);
    if (point->distpoint) {
      print_distpoint(out, point->distpoint, indent);
    }
    if (point->reasons) {
      print_reasons(out, "Reasons", point->reasons, indent);
    }
    if (point->CRLissuer) {
      BIO_printf(out, "%*sCRL Issuer:\n", indent, "");
      print_gens(out, point->CRLissuer, indent);
    }
  }
  return 1;
}